

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O0

int riscv_cpu_claim_interrupts_riscv32(RISCVCPU *cpu,uint32_t interrupts)

{
  CPURISCVState_conflict *env;
  uint32_t interrupts_local;
  RISCVCPU *cpu_local;
  
  if (((cpu->env).miclaim & interrupts) == 0) {
    (cpu->env).miclaim = interrupts | (cpu->env).miclaim;
    cpu_local._4_4_ = 0;
  }
  else {
    cpu_local._4_4_ = -1;
  }
  return cpu_local._4_4_;
}

Assistant:

int riscv_cpu_claim_interrupts(RISCVCPU *cpu, uint32_t interrupts)
{
    CPURISCVState *env = &cpu->env;
    if (env->miclaim & interrupts) {
        return -1;
    } else {
        env->miclaim |= interrupts;
        return 0;
    }
}